

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O1

void __thiscall
fmt::v11::detail::dynamic_arg_list::
typed_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~typed_node(typed_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer p;
  node<void> *pnVar2;
  
  (this->super_node<void>)._vptr_node = (_func_int **)&PTR__typed_node_00cc2f18;
  p = (this->value)._M_dataplus._M_p;
  paVar1 = &(this->value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p != paVar1) {
    operator_delete(p,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_node<void>)._vptr_node = (_func_int **)&PTR__node_00cc2f60;
  pnVar2 = (this->super_node<void>).next._M_t.
           super___uniq_ptr_impl<fmt::v11::detail::node<void>,_std::default_delete<fmt::v11::detail::node<void>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_fmt::v11::detail::node<void>_*,_std::default_delete<fmt::v11::detail::node<void>_>_>
           .super__Head_base<0UL,_fmt::v11::detail::node<void>_*,_false>._M_head_impl;
  if (pnVar2 != (node<void> *)0x0) {
    (*pnVar2->_vptr_node[1])();
  }
  (this->super_node<void>).next._M_t.
  super___uniq_ptr_impl<fmt::v11::detail::node<void>,_std::default_delete<fmt::v11::detail::node<void>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_fmt::v11::detail::node<void>_*,_std::default_delete<fmt::v11::detail::node<void>_>_>
  .super__Head_base<0UL,_fmt::v11::detail::node<void>_*,_false>._M_head_impl = (node<void> *)0x0;
  operator_delete(this,0x30);
  return;
}

Assistant:

class dynamic_arg_list {
  template <typename T> struct typed_node : node<> {
    T value;

    template <typename Arg>
    FMT_CONSTEXPR typed_node(const Arg& arg) : value(arg) {}

    template <typename Char>
    FMT_CONSTEXPR typed_node(const basic_string_view<Char>& arg)
        : value(arg.data(), arg.size()) {}
  };

  std::unique_ptr<node<>> head_;

 public:
  template <typename T, typename Arg> auto push(const Arg& arg) -> const T& {
    auto new_node = std::unique_ptr<typed_node<T>>(new typed_node<T>(arg));
    auto& value = new_node->value;
    new_node->next = std::move(head_);
    head_ = std::move(new_node);
    return value;
  }
};
}  // namespace detail

/**
 * A dynamic list of formatting arguments with storage.
 *
 * It can be implicitly converted into `fmt::basic_format_args` for passing
 * into type-erased formatting functions such as `fmt::vformat`.
 */
template <typename Context> class dynamic_format_arg_store {
 private:
  using char_type = typename Context::char_type;

  template <typename T> struct need_copy {
    static constexpr detail::type mapped_type =
        detail::mapped_type_constant<T, char_type>::value;

    enum {
      value = !(detail::is_reference_wrapper<T>::value ||
                std::is_same<T, basic_string_view<char_type>>::value ||
                std::is_same<T, detail::std_string_view<char_type>>::value ||
                (mapped_type != detail::type::cstring_type &&
                 mapped_type != detail::type::string_type &&
                 mapped_type != detail::type::custom_type))
    };
  }